

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

void server::writedemo(int chan,void *data,int len)

{
  long lVar1;
  int stamp [3];
  undefined4 local_1c;
  int local_18;
  int local_14;
  
  if (demorecord != (long *)0x0) {
    local_1c = gamemillis;
    local_18 = chan;
    local_14 = len;
    (**(code **)(*demorecord + 0x50))(demorecord,&local_1c,0xc);
    (**(code **)(*demorecord + 0x50))(demorecord,data,len);
    lVar1 = (**(code **)(*demorecord + 0x28))();
    if (maxdemosize << 0x14 <= lVar1) {
      enddemorecord();
    }
  }
  return;
}

Assistant:

void writedemo(int chan, void *data, int len)
    {
        if(!demorecord) return;
        int stamp[3] = { gamemillis, chan, len };
        lilswap(stamp, 3);
        demorecord->write(stamp, sizeof(stamp));
        demorecord->write(data, len);
        if(demorecord->rawtell() >= (maxdemosize<<20)) enddemorecord();
    }